

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O0

void anon_unknown.dwarf_23dc62::check<Imath_3_2::half>(istream *is,half c)

{
  char *pcVar1;
  ostream *poVar2;
  void *this;
  half in_SI;
  float fVar3;
  float fVar4;
  half v;
  half *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  half local_12;
  
  Imf_3_2::Xdr::read<(anonymous_namespace)::CharIO,std::istream>
            ((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
            );
  pcVar1 = std::type_info::name((type_info *)&Imath_3_2::half::typeinfo);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,": expected ");
  poVar2 = (ostream *)::operator<<(poVar2,in_SI);
  poVar2 = std::operator<<(poVar2,", got ");
  this = (void *)::operator<<(poVar2,local_12);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  fVar3 = Imath_3_2::half::operator_cast_to_float
                    ((half *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  fVar4 = Imath_3_2::half::operator_cast_to_float((half *)CONCAT44(fVar3,in_stack_ffffffffffffffe0))
  ;
  if ((fVar3 == fVar4) && (!NAN(fVar3) && !NAN(fVar4))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = Imath_3_2::half]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}